

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O1

void Tests::AddInstructionEvaluionFail(char *reason)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar2 = instructionEvaluionFails;
  uVar7 = (ulong)instructionEvaluionFails;
  bVar8 = uVar7 != 0;
  if (bVar8) {
    iVar3 = strcmp(instructionEvaluionFailInfo,reason);
    puVar6 = &instructionEvaluionFailInfo;
    if (iVar3 != 0) {
      puVar6 = &instructionEvaluionFailInfo;
      uVar5 = 0;
      do {
        if (uVar7 - 1 == uVar5) goto LAB_00185042;
        puVar1 = puVar6 + 2;
        puVar6 = puVar6 + 2;
        iVar3 = strcmp((char *)*puVar1,reason);
        uVar5 = uVar5 + 1;
      } while (iVar3 != 0);
      bVar8 = uVar5 < uVar7;
    }
    *(int *)(puVar6 + 1) = *(int *)(puVar6 + 1) + 1;
    if (bVar8) {
      return;
    }
  }
LAB_00185042:
  if (uVar2 < 0x80) {
    pcVar4 = strdup(reason);
    (&instructionEvaluionFailInfo)[uVar7 * 2] = pcVar4;
    (&DAT_003fd6c8)[uVar7 * 4] = 1;
    instructionEvaluionFails = uVar2 + 1;
    return;
  }
  __assert_fail("instructionEvaluionFails < 128",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/TestBase.cpp"
                ,0xec,"void Tests::AddInstructionEvaluionFail(const char *)");
}

Assistant:

void AddInstructionEvaluionFail(const char *reason)
	{
		for(unsigned i = 0; i < instructionEvaluionFails; i++)
		{
			if(strcmp(instructionEvaluionFailInfo[i].reason, reason) == 0)
			{
				instructionEvaluionFailInfo[i].count++;
				return;
			}
		}
		assert(instructionEvaluionFails < 128);

		if(instructionEvaluionFails < 128)
		{
			instructionEvaluionFailInfo[instructionEvaluionFails].reason = strdup(reason);
			instructionEvaluionFailInfo[instructionEvaluionFails].count = 1;
			instructionEvaluionFails++;
		}
	}